

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oasis.h
# Opt level: O2

void logprintf(string *program_name,string *msgtype,char *format,...)

{
  char in_AL;
  __pid_t _Var1;
  FILE *__stream;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  string b2;
  string base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  std::__cxx11::string::string((string *)&local_178,"/\\",(allocator *)&local_1b8);
  base_name<std::__cxx11::string>(&local_158,program_name,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::string((string *)&local_198,"/\\",(allocator *)&local_138);
  base_name<std::__cxx11::string>(&local_1b8,&local_158,&local_198);
  remove_extension<std::__cxx11::string>(&local_178,&local_1b8);
  std::__cxx11::string::operator=((string *)&local_158,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::operator+(&local_1b8,&local_158,":");
  _Var1 = getpid();
  std::__cxx11::to_string(&local_198,_Var1);
  std::operator+(&local_178,&local_1b8,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::operator+(&local_f8,"log/",&local_158);
  std::operator+(&local_138,&local_f8,"_");
  _Var1 = getpid();
  std::__cxx11::to_string(&local_118,_Var1);
  std::operator+(&local_198,&local_138,&local_118);
  std::operator+(&local_1b8,&local_198,".log");
  std::__cxx11::string::operator=((string *)&local_158,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_f8);
  __stream = fopen(local_158._M_dataplus._M_p,"a");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"%s:%s:",(msgtype->_M_dataplus)._M_p,local_178._M_dataplus._M_p);
    local_1b8.field_2._M_allocated_capacity = (size_type)local_d8;
    local_1b8._M_string_length = (size_type)&args[0].overflow_arg_area;
    local_1b8._M_dataplus._M_p = (pointer)0x3000000018;
    vfprintf(__stream,format,&local_1b8);
    fclose(__stream);
  }
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  return;
}

Assistant:

inline  void logprintf(const std::string &program_name,const std::string &msgtype,const char* format, ...)
{
	
	std::string base = base_name(program_name);
	base = remove_extension(base_name(base));
	std::string b2 = base + ":" + std::to_string(GETPID());
	base = "log/" + base + "_" + std::to_string(GETPID()) + ".log";

	FILE* fout = fopen(base.c_str(), "a");
	if (fout != nullptr) {
		fprintf(fout, "%s:%s:",msgtype.c_str(),b2.c_str());
		va_list args;
		va_start(args, format);
		vfprintf(fout, format, args);
		va_end(args);
		fclose(fout);
	}
	
}